

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O0

void __thiscall HEkkDualRHS::updateInfeasList(HEkkDualRHS *this,HVector *column)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  HighsTimer *pHVar5;
  int *piVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  long in_RSI;
  HighsSimplexAnalysis *in_RDI;
  HighsInt iRow_1;
  HighsInt i_1;
  HighsInt iRow;
  HighsInt i;
  vector<double,_std::allocator<double>_> *edge_weight;
  HighsInt *variable_index;
  HighsInt columnCount;
  HighsInt in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_34;
  int local_2c;
  
  iVar2 = *(int *)(in_RSI + 4);
  piVar6 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x79a962);
  if (-1 < *(int *)&(in_RDI->thread_simplex_clocks).
                    super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
    HighsSimplexAnalysis::simplexTimerStart
              (in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
    pHVar5 = in_RDI->timer_;
    if (0.0 < (double)(in_RDI->thread_simplex_clocks).
                      super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
                      super__Vector_impl_data._M_start) {
      for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
        iVar3 = piVar6[local_34];
        pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &(in_RDI->thread_simplex_clocks).
                             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar3);
        if (*pvVar7 == '\0') {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&in_RDI->numTot,(long)iVar3
                             );
          dVar1 = *pvVar8;
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)
                              &pHVar5[0x4f].clock_num_call.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(long)iVar3);
          if (*pvVar8 * (double)(in_RDI->thread_simplex_clocks).
                                super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                ._M_impl.super__Vector_impl_data._M_start < dVar1) {
            iVar4 = *(int *)&(in_RDI->thread_simplex_clocks).
                             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
            *(int *)&(in_RDI->thread_simplex_clocks).
                     super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
                     super__Vector_impl_data._M_finish = iVar4 + 1;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &(in_RDI->thread_factor_clocks).
                                 super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar4);
            *pvVar9 = iVar3;
            pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)
                                &(in_RDI->thread_simplex_clocks).
                                 super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar3);
            *pvVar7 = '\x01';
          }
        }
      }
    }
    else {
      for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
        iVar3 = piVar6[local_2c];
        pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)
                            &(in_RDI->thread_simplex_clocks).
                             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar3);
        if (*pvVar7 == '\0') {
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&in_RDI->numTot,(long)iVar3
                             );
          if ((*pvVar8 != 0.0) || (NAN(*pvVar8))) {
            iVar4 = *(int *)&(in_RDI->thread_simplex_clocks).
                             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
            *(int *)&(in_RDI->thread_simplex_clocks).
                     super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
                     super__Vector_impl_data._M_finish = iVar4 + 1;
            in_stack_ffffffffffffffbc = iVar3;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &(in_RDI->thread_factor_clocks).
                                 super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar4);
            *pvVar9 = in_stack_ffffffffffffffbc;
            pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)
                                &(in_RDI->thread_simplex_clocks).
                                 super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar3);
            *pvVar7 = '\x01';
          }
        }
      }
    }
    HighsSimplexAnalysis::simplexTimerStop
              (in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void HEkkDualRHS::updateInfeasList(HVector* column) {
  const HighsInt columnCount = column->count;
  const HighsInt* variable_index = column->index.data();

  // DENSE mode: disabled
  if (workCount < 0) return;

  analysis->simplexTimerStart(UpdatePrimalClock);

  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCutoff <= 0) {
    // The regular sparse way
    for (HighsInt i = 0; i < columnCount; i++) {
      HighsInt iRow = variable_index[i];
      if (workMark[iRow] == 0) {
        if (work_infeasibility[iRow]) {
          workIndex[workCount++] = iRow;
          workMark[iRow] = 1;
        }
      }
    }
  } else {
    // The hyper sparse way
    for (HighsInt i = 0; i < columnCount; i++) {
      HighsInt iRow = variable_index[i];
      if (workMark[iRow] == 0) {
        if (work_infeasibility[iRow] > edge_weight[iRow] * workCutoff) {
          workIndex[workCount++] = iRow;
          workMark[iRow] = 1;
        }
      }
    }
  }

  analysis->simplexTimerStop(UpdatePrimalClock);
}